

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

int64 google::Int64FromEnv(char *v,int64 dflt)

{
  long lVar1;
  int64 dflt_local;
  char *v_local;
  
  lVar1 = anon_unknown_1::GetFromEnv<long>(v,"int64",dflt);
  return lVar1;
}

Assistant:

int64 Int64FromEnv(const char *v, int64 dflt)    {
  return GetFromEnv(v, "int64", dflt);
}